

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roll-parser.cpp
# Opt level: O1

void ORPG::Roll::PRINT_VERSION_FLAG(void)

{
  fputs("roll (openrpg) v0.6.0 - (C) 2016-2025 Nicholas Gaulke\nOpenRPG Software License - Version 1.0 - February 10th, 2017 <https://openrpg.io/about/license/>\nThis is free software: you are free to change and redistribute it.\nThere is NO WARRANTY, to the extent permitted by law.\n\n"
        ,_stdout);
  exit(0);
}

Assistant:

void PRINT_VERSION_FLAG() {
            fputs("roll (openrpg) " VERSION " - " COPYRIGHT "\n"
                "OpenRPG Software License - Version 1.0 - February 10th, 2017 <https://openrpg.io/about/license/>\n"
                "This is free software: you are free to change and redistribute it.\n"
                "There is NO WARRANTY, to the extent permitted by law.\n\n",
                stdout);
            exit(EXIT_SUCCESS);
        }